

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertySpecification.cpp
# Opt level: O3

bool __thiscall
Rml::PropertySpecification::ParsePropertyDeclaration
          (PropertySpecification *this,PropertyDictionary *dictionary,String *property_name,
          String *property_value)

{
  PropertyId property_id;
  ShorthandId shorthand_id;
  PropertyIdNameMap *pPVar1;
  ShorthandIdNameMap *pSVar2;
  bool bVar3;
  size_t sVar4;
  Node *pNVar5;
  Node *pNVar6;
  
  pPVar1 = (this->property_map)._M_t.
           super___uniq_ptr_impl<Rml::PropertyIdNameMap,_std::default_delete<Rml::PropertyIdNameMap>_>
           ._M_t.
           super__Tuple_impl<0UL,_Rml::PropertyIdNameMap_*,_std::default_delete<Rml::PropertyIdNameMap>_>
           .super__Head_base<0UL,_Rml::PropertyIdNameMap_*,_false>._M_head_impl;
  sVar4 = robin_hood::detail::
          Table<true,80ul,std::__cxx11::string,Rml::PropertyId,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
          ::findIdx<std::__cxx11::string>
                    ((Table<true,80ul,std::__cxx11::string,Rml::PropertyId,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
                      *)&(pPVar1->super_IdNameMap<Rml::PropertyId>).reverse_map,property_name);
  pNVar5 = (pPVar1->super_IdNameMap<Rml::PropertyId>).reverse_map.mKeyVals + sVar4;
  if ((pNVar5 != *(Node **)((long)&(pPVar1->super_IdNameMap<Rml::PropertyId>).reverse_map + 8)) &&
     (property_id = *(PropertyId *)((long)&pNVar5->mData + 0x20), property_id != Invalid)) {
    bVar3 = ParsePropertyDeclaration(this,dictionary,property_id,property_value);
    return bVar3;
  }
  pSVar2 = (this->shorthand_map)._M_t.
           super___uniq_ptr_impl<Rml::ShorthandIdNameMap,_std::default_delete<Rml::ShorthandIdNameMap>_>
           ._M_t.
           super__Tuple_impl<0UL,_Rml::ShorthandIdNameMap_*,_std::default_delete<Rml::ShorthandIdNameMap>_>
           .super__Head_base<0UL,_Rml::ShorthandIdNameMap_*,_false>._M_head_impl;
  sVar4 = robin_hood::detail::
          Table<true,80ul,std::__cxx11::string,Rml::ShorthandId,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
          ::findIdx<std::__cxx11::string>
                    ((Table<true,80ul,std::__cxx11::string,Rml::ShorthandId,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
                      *)&(pSVar2->super_IdNameMap<Rml::ShorthandId>).reverse_map,property_name);
  pNVar6 = (pSVar2->super_IdNameMap<Rml::ShorthandId>).reverse_map.mKeyVals + sVar4;
  if ((pNVar6 != *(Node **)((long)&(pSVar2->super_IdNameMap<Rml::ShorthandId>).reverse_map + 8)) &&
     (shorthand_id = *(ShorthandId *)((long)&pNVar6->mData + 0x20), shorthand_id != Invalid)) {
    bVar3 = ParseShorthandDeclaration(this,dictionary,shorthand_id,property_value);
    return bVar3;
  }
  return false;
}

Assistant:

bool PropertySpecification::ParsePropertyDeclaration(PropertyDictionary& dictionary, const String& property_name, const String& property_value) const
{
	RMLUI_ZoneScoped;

	// Try as a property first
	PropertyId property_id = property_map->GetId(property_name);
	if (property_id != PropertyId::Invalid)
		return ParsePropertyDeclaration(dictionary, property_id, property_value);

	// Then, as a shorthand
	ShorthandId shorthand_id = shorthand_map->GetId(property_name);
	if (shorthand_id != ShorthandId::Invalid)
		return ParseShorthandDeclaration(dictionary, shorthand_id, property_value);

	return false;
}